

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

void __thiscall file_hash_8::test_method(file_hash_8 *this)

{
  uchar uVar1;
  const_string local_d0;
  undefined **local_c0;
  undefined1 local_b8;
  undefined1 *local_b0;
  uchar **local_a8;
  undefined **local_a0;
  undefined1 local_98;
  undefined1 *local_90;
  uchar **local_88;
  assertion_result local_80;
  lazy_ostream local_68;
  undefined1 *local_58;
  char *local_50;
  uchar *local_48;
  uchar *local_40;
  uchar local_38 [7];
  uchar local_31;
  
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1bb840,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x19c7a3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x37;
  local_68.m_empty = false;
  local_68._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001b8980;
  local_58 = boost::unit_test::lazy_ostream::inst;
  local_50 = "";
  local_31 = assert_hash::details::file_hash_impl<unsigned_char>('\0',"",0);
  local_48 = &local_31;
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_31 == '\0');
  local_40 = local_38;
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_d0.m_end = "";
  local_a8 = &local_48;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_001b8d00;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_88 = &local_40;
  local_98 = 0;
  local_a0 = &PTR__lazy_ostream_001b8b40;
  local_90 = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,&local_68,&local_d0,0x37,CHECK,CHECK_EQUAL,2,
             "ah::file_hash< std::uint8_t >( \"\" )",&local_c0,"0",&local_a0);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1bb840,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x19c7a3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x38;
  local_68.m_empty = false;
  local_68._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001b8980;
  local_58 = boost::unit_test::lazy_ostream::inst;
  local_50 = "";
  uVar1 = assert_hash::details::file_hash_impl<unsigned_char>('\0',"a",0);
  local_38[0] = uVar1;
  local_31 = 'a';
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(uVar1 == 'a');
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_d0.m_end = "";
  local_48 = local_38;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_001b8d00;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_48;
  local_40 = &local_31;
  local_98 = 0;
  local_a0 = &PTR__lazy_ostream_001b8cc0;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = &local_40;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,&local_68,&local_d0,0x38,CHECK,CHECK_EQUAL,2,
             "ah::file_hash< std::uint8_t >( \"a\" )",&local_c0,"\'a\'",&local_a0);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1bb840,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x19c7a3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x39;
  local_68.m_empty = false;
  local_68._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001b8980;
  local_58 = boost::unit_test::lazy_ostream::inst;
  local_50 = "";
  local_31 = assert_hash::details::file_hash_impl<unsigned_char>('\0',"ab",0);
  local_38[0] = 0xc3;
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_31 == 0xc3);
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_d0.m_end = "";
  local_48 = &local_31;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_001b8d00;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_48;
  local_40 = local_38;
  local_98 = 0;
  local_a0 = &PTR__lazy_ostream_001b8b40;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = &local_40;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,&local_68,&local_d0,0x39,CHECK,CHECK_EQUAL,2,
             "ah::file_hash< std::uint8_t >( \"ab\" )",&local_c0,"\'a\' + \'b\'",&local_a0);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1bb840,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x19c7a3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x3a;
  local_68.m_empty = false;
  local_68._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001b8980;
  local_58 = boost::unit_test::lazy_ostream::inst;
  local_50 = "";
  local_31 = assert_hash::details::file_hash_impl<unsigned_char>('\0',"abc",0);
  local_38[0] = '&';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_31 == '&');
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_d0.m_end = "";
  local_48 = &local_31;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_001b8d00;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_48;
  local_40 = local_38;
  local_98 = 0;
  local_a0 = &PTR__lazy_ostream_001b8b40;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = &local_40;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,&local_68,&local_d0,0x3a,CHECK,CHECK_EQUAL,2,
             "ah::file_hash< std::uint8_t >( \"abc\" )",&local_c0,"( \'a\' + \'b\' + \'c\' ) & 0xff"
             ,&local_a0);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( file_hash_8 )
{
    BOOST_CHECK_EQUAL( ah::file_hash< std::uint8_t >( "" ), 0 );
    BOOST_CHECK_EQUAL( ah::file_hash< std::uint8_t >( "a" ), 'a' );
    BOOST_CHECK_EQUAL( ah::file_hash< std::uint8_t >( "ab" ), 'a' + 'b' );
    BOOST_CHECK_EQUAL( ah::file_hash< std::uint8_t >( "abc" ), ( 'a' + 'b' + 'c' ) & 0xff );
}